

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSet.cpp
# Opt level: O1

cstr idx2::ToString(metadata *Meta)

{
  int iVar1;
  int iVar2;
  name_map *pnVar3;
  dtype dVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  long *in_FS_OFFSET;
  bool bVar8;
  printer Pr;
  printer local_30;
  
  pcVar7 = (char *)(*in_FS_OFFSET + -0x580);
  printer::printer(&local_30,pcVar7,0x180);
  if ((FILE *)local_30.File == (FILE *)0x0 && local_30.Buf != (char *)0x0) {
    if ((long)local_30.Size < 2) {
      pcVar7 = "false && \"buffer too small\"";
LAB_0010b58d:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                    ,0x24,"cstr idx2::ToString(const metadata &)");
    }
    iVar2 = snprintf(local_30.Buf,(long)local_30.Size,"name = %s\n",Meta);
    local_30.Buf = local_30.Buf + iVar2;
    iVar1 = local_30.Size - iVar2;
    bVar8 = local_30.Size < iVar2;
    local_30.Size = iVar1;
    if (iVar1 == 0 || bVar8) {
      pcVar7 = "false && \"buffer overflow?\"";
      goto LAB_0010b58d;
    }
  }
  else {
    if ((local_30.Buf != (char *)0x0) || ((FILE *)local_30.File == (FILE *)0x0)) {
      pcVar7 = "false && \"unavailable or ambiguous printer destination\"";
      goto LAB_0010b58d;
    }
    fprintf((FILE *)local_30.File,"name = %s\n",Meta);
  }
  if ((FILE *)local_30.File == (FILE *)0x0 && local_30.Buf != (char *)0x0) {
    if ((long)local_30.Size < 2) {
      pcVar7 = "false && \"buffer too small\"";
LAB_0010b5be:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                    ,0x25,"cstr idx2::ToString(const metadata &)");
    }
    iVar1 = snprintf(local_30.Buf,(long)local_30.Size,"field = %s\n",Meta->Field);
    local_30.Buf = local_30.Buf + iVar1;
    iVar2 = local_30.Size - iVar1;
    if (local_30.Size - iVar1 == 0 || local_30.Size < iVar1) {
      pcVar7 = "false && \"buffer overflow?\"";
      goto LAB_0010b5be;
    }
  }
  else {
    if ((local_30.Buf != (char *)0x0) || ((FILE *)local_30.File == (FILE *)0x0)) {
      pcVar7 = "false && \"unavailable or ambiguous printer destination\"";
      goto LAB_0010b5be;
    }
    fprintf((FILE *)local_30.File,"field = %s\n",Meta->Field);
    iVar2 = local_30.Size;
  }
  local_30.Size = iVar2;
  if ((FILE *)local_30.File == (FILE *)0x0 && local_30.Buf != (char *)0x0) {
    if ((long)local_30.Size < 2) {
      pcVar7 = "false && \"buffer too small\"";
    }
    else {
      iVar1 = snprintf(local_30.Buf,(long)local_30.Size,"dimensions = %d %d %d\n",
                       (ulong)(uint)(Meta->Dims3).field_0.field_0.X,
                       (ulong)(uint)(Meta->Dims3).field_0.field_0.Y,
                       (ulong)(uint)(Meta->Dims3).field_0.field_0.Z);
      local_30.Buf = local_30.Buf + iVar1;
      iVar2 = local_30.Size - iVar1;
      if (local_30.Size - iVar1 != 0 && iVar1 <= local_30.Size) goto LAB_0010b457;
      pcVar7 = "false && \"buffer overflow?\"";
    }
  }
  else {
    if ((local_30.Buf == (char *)0x0) && ((FILE *)local_30.File != (FILE *)0x0)) {
      fprintf((FILE *)local_30.File,"dimensions = %d %d %d\n",
              (ulong)(uint)(Meta->Dims3).field_0.field_0.X,
              (ulong)(uint)(Meta->Dims3).field_0.field_0.Y,
              (ulong)(uint)(Meta->Dims3).field_0.field_0.Z);
      iVar2 = local_30.Size;
LAB_0010b457:
      local_30.Size = iVar2;
      pnVar3 = &dtype_s::NameMap;
      dVar4 = dtype_s::NameMap.Arr[0].ItemVal;
      if (dtype_s::NameMap.Arr[0].ItemVal != Meta->DType) {
        lVar5 = 0x28;
        do {
          if (lVar5 == 0x100) {
            dVar4 = __Invalid__;
            break;
          }
          dVar4 = *(dtype *)((long)&dtype_s::NameMap.Arr[0].Name.field_0 + lVar5);
          lVar5 = lVar5 + 0x18;
        } while (dVar4 != Meta->DType);
      }
      if (dtype_s::NameMap.Arr[0].ItemVal == dVar4) {
        bVar8 = false;
      }
      else {
        lVar5 = 0;
        do {
          lVar6 = lVar5;
          bVar8 = lVar6 == 0xd8;
          if (bVar8) goto LAB_0010b555;
          lVar5 = lVar6 + 0x18;
        } while ((&dtype_s::NameMap.Arr[1].ItemVal)[lVar6] != dVar4);
        pnVar3 = (name_map *)((long)&dtype_s::NameMap.Arr[1].Name.field_0 + lVar6);
      }
      if (!bVar8) {
        if ((FILE *)local_30.File == (FILE *)0x0 && local_30.Buf != (char *)0x0) {
          if ((long)local_30.Size < 2) {
            pcVar7 = "false && \"buffer too small\"";
          }
          else {
            iVar2 = snprintf(local_30.Buf,(long)local_30.Size,"data type = %.*s");
            local_30.Buf = local_30.Buf + iVar2;
            if (iVar2 < local_30.Size) {
              return pcVar7;
            }
            pcVar7 = "false && \"buffer overflow?\"";
          }
        }
        else {
          if ((local_30.Buf == (char *)0x0) && ((FILE *)local_30.File != (FILE *)0x0)) {
            fprintf((FILE *)local_30.File,"data type = %.*s",(ulong)(uint)pnVar3->Arr[0].Name.Size,
                    pnVar3->Arr[0].Name.field_0.Ptr);
            return pcVar7;
          }
          pcVar7 = "false && \"unavailable or ambiguous printer destination\"";
        }
        __assert_fail(pcVar7,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                      ,0x28,"cstr idx2::ToString(const metadata &)");
      }
LAB_0010b555:
      __assert_fail("It != End(EnumS.NameMap)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataTypes.h"
                    ,10,"stref idx2::ToString(dtype)");
    }
    pcVar7 = "false && \"unavailable or ambiguous printer destination\"";
  }
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                ,0x26,"cstr idx2::ToString(const metadata &)");
}

Assistant:

cstr
ToString(const metadata& Meta)
{
  printer Pr(Meta.String, sizeof(Meta.String));
  idx2_Print(&Pr, "name = %s\n", Meta.Name);
  idx2_Print(&Pr, "field = %s\n", Meta.Field);
  idx2_Print(&Pr, "dimensions = %d %d %d\n", Meta.Dims3.X, Meta.Dims3.Y, Meta.Dims3.Z);
  stref TypeStr = ToString(Meta.DType);
  idx2_Print(&Pr, "data type = %.*s", TypeStr.Size, TypeStr.Ptr);

  return Meta.String;
}